

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateDoWhile(ExpressionEvalContext *ctx,ExprDoWhile *expression)

{
  StackFrame *expression_00;
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  long local_38;
  longlong result;
  ExprBase *condition;
  StackFrame *frame;
  ExprDoWhile *expression_local;
  ExpressionEvalContext *ctx_local;
  
  frame = (StackFrame *)expression;
  expression_local = (ExprDoWhile *)ctx;
  ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  condition = (ExprBase *)*ppSVar2;
  do {
    do {
      bVar1 = AddInstruction((ExpressionEvalContext *)expression_local);
      if (!bVar1) {
        return (ExprBase *)0x0;
      }
      pEVar3 = Evaluate((ExpressionEvalContext *)expression_local,
                        &((frame->variables).little[1].ptr)->super_ExprBase);
      if (pEVar3 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      if (*(int *)((long)&condition[0xb].type + 4) != 0) {
        *(int *)((long)&condition[0xb].type + 4) = *(int *)((long)&condition[0xb].type + 4) + -1;
        goto LAB_0016a5aa;
      }
      if (((*(int *)&condition[0xb].next != 0) &&
          (*(int *)&condition[0xb].next = *(int *)&condition[0xb].next + -1,
          *(int *)&condition[0xb].next != 0)) || (condition[0xb].source != (SynBase *)0x0))
      goto LAB_0016a5aa;
    } while (*(int *)&condition[0xb].type != 0);
    result = (longlong)
             Evaluate((ExpressionEvalContext *)expression_local,
                      (ExprBase *)(frame->variables).little[2].variable);
    if ((ExprBase *)result == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    bVar1 = TryTakeLong((ExprBase *)result,&local_38);
    if (!bVar1) {
      pEVar3 = Report((ExpressionEvalContext *)expression_local,
                      "ERROR: failed to evaluate \'do\' condition");
      return pEVar3;
    }
  } while (local_38 != 0);
LAB_0016a5aa:
  expression_00 = frame;
  pEVar3 = &ExpressionContext::get<ExprVoid>
                      ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
            super_ExprBase;
  ExprVoid::ExprVoid((ExprVoid *)pEVar3,*(SynBase **)&(frame->variables).count,
                     (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
  pEVar3 = CheckType((ExprBase *)expression_00,pEVar3);
  return pEVar3;
}

Assistant:

ExprBase* EvaluateDoWhile(ExpressionEvalContext &ctx, ExprDoWhile *expression)
{
	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(;;)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!Evaluate(ctx, expression->body))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;
			break;
		}

		// On continue, decrease depth and proceed to next iteration, unless it's a multi-level continue
		if(frame->continueDepth)
		{
			frame->continueDepth--;

			if(frame->continueDepth)
				break;
		}

		if(frame->returnValue)
			break;

		if(!frame->targetYield)
		{
			ExprBase *condition = Evaluate(ctx, expression->condition);

			if(!condition)
				return NULL;

			long long result;
			if(!TryTakeLong(condition, result))
				return Report(ctx, "ERROR: failed to evaluate 'do' condition");

			if(!result)
				break;
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}